

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

void __thiscall
re2::RE2::CapturingGroupNames::anon_class_8_1_8991fb9c::operator()(anon_class_8_1_8991fb9c *this)

{
  RE2 *pRVar1;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar2;
  anon_class_8_1_8991fb9c *this_local;
  
  pRVar1 = this->this;
  if (pRVar1->suffix_regexp_ != (Regexp *)0x0) {
    pmVar2 = Regexp::CaptureNames_abi_cxx11_(pRVar1->suffix_regexp_);
    pRVar1->group_names_ = pmVar2;
  }
  if (pRVar1->group_names_ ==
      (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)0x0) {
    pRVar1->group_names_ = empty_group_names_abi_cxx11_;
  }
  return;
}

Assistant:

const map<int, string>& RE2::CapturingGroupNames() const {
  std::call_once(group_names_once_, [this]() {
    if (suffix_regexp_ != NULL)
      group_names_ = suffix_regexp_->CaptureNames();
    if (group_names_ == NULL)
      group_names_ = empty_group_names;
  });
  return *group_names_;
}